

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itoa.h
# Opt level: O0

char * rapidjson::internal::i64toa(int64_t value,char *buffer)

{
  char *pcVar1;
  uint64_t local_20;
  uint64_t u;
  char *buffer_local;
  int64_t value_local;
  
  if (buffer != (char *)0x0) {
    local_20 = value;
    u = (uint64_t)buffer;
    if (value < 0) {
      u = (uint64_t)(buffer + 1);
      *buffer = '-';
      local_20 = (value ^ 0xffffffffffffffffU) + 1;
    }
    pcVar1 = u64toa(local_20,(char *)u);
    return pcVar1;
  }
  __assert_fail("buffer != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/itoa.h"
                ,0x127,"char *rapidjson::internal::i64toa(int64_t, char *)");
}

Assistant:

inline char* i64toa(int64_t value, char* buffer) {
    RAPIDJSON_ASSERT(buffer != 0);
    uint64_t u = static_cast<uint64_t>(value);
    if (value < 0) {
        *buffer++ = '-';
        u = ~u + 1;
    }

    return u64toa(u, buffer);
}